

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cc
# Opt level: O0

void predict(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *args)

{
  bool bVar1;
  byte bVar2;
  size_type sVar3;
  const_reference pvVar4;
  ostream *this;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_RDI;
  vector<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  predictions;
  istream *in;
  bool inputIsStdIn;
  string infile;
  ifstream ifs;
  FastText fasttext;
  bool printProb;
  real threshold;
  int32_t k;
  undefined6 in_stack_fffffffffffffcc8;
  undefined1 in_stack_fffffffffffffcce;
  undefined1 in_stack_fffffffffffffccf;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffcd0;
  undefined1 in_stack_fffffffffffffcee;
  undefined1 in_stack_fffffffffffffcef;
  vector<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *in_stack_fffffffffffffcf0;
  FastText *in_stack_fffffffffffffd00;
  string local_2f0 [32];
  string local_2d0 [144];
  real in_stack_fffffffffffffdc0;
  int32_t in_stack_fffffffffffffdc4;
  vector<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *in_stack_fffffffffffffdc8;
  istream *in_stack_fffffffffffffdd0;
  FastText *in_stack_fffffffffffffdd8;
  string local_b8 [16];
  string *in_stack_ffffffffffffff58;
  FastText *in_stack_ffffffffffffff60;
  
  sVar3 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size(in_RDI);
  if ((sVar3 < 4) ||
     (sVar3 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::size(in_RDI), 6 < sVar3)) {
    printPredictUsage();
    exit(1);
  }
  sVar3 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size(in_RDI);
  if (4 < sVar3) {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator[](in_RDI,4);
    std::__cxx11::stoi(in_stack_fffffffffffffcd0,
                       (size_t *)
                       CONCAT17(in_stack_fffffffffffffccf,
                                CONCAT16(in_stack_fffffffffffffcce,in_stack_fffffffffffffcc8)),0);
    sVar3 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::size(in_RDI);
    if (sVar3 == 6) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::operator[](in_RDI,5);
      std::__cxx11::stof(in_stack_fffffffffffffcd0,
                         (size_t *)
                         CONCAT17(in_stack_fffffffffffffccf,
                                  CONCAT16(in_stack_fffffffffffffcce,in_stack_fffffffffffffcc8)));
    }
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator[](in_RDI,1);
  std::operator==(in_stack_fffffffffffffcd0,
                  (char *)CONCAT17(in_stack_fffffffffffffccf,
                                   CONCAT16(in_stack_fffffffffffffcce,in_stack_fffffffffffffcc8)));
  ::fasttext::FastText::FastText(in_stack_fffffffffffffd00);
  pvVar4 = std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::operator[](in_RDI,2);
  std::__cxx11::string::string(local_b8,(string *)pvVar4);
  ::fasttext::FastText::loadModel(in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
  std::__cxx11::string::~string(local_b8);
  std::ifstream::ifstream(local_2d0);
  pvVar4 = std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::operator[](in_RDI,3);
  std::__cxx11::string::string(local_2f0,(string *)pvVar4);
  bVar1 = std::operator==(in_stack_fffffffffffffcd0,
                          (char *)CONCAT17(in_stack_fffffffffffffccf,
                                           CONCAT16(in_stack_fffffffffffffcce,
                                                    in_stack_fffffffffffffcc8)));
  if (((!bVar1) && (std::ifstream::open(local_2d0,(_Ios_Openmode)local_2f0), !bVar1)) &&
     (bVar2 = std::ifstream::is_open(), (bVar2 & 1) == 0)) {
    this = std::operator<<((ostream *)&std::cerr,"Input file cannot be opened!");
    std::ostream::operator<<(this,std::endl<char,std::char_traits<char>>);
    exit(1);
  }
  std::
  vector<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::vector((vector<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            *)0x1d8e49);
  while (bVar1 = ::fasttext::FastText::predictLine
                           (in_stack_fffffffffffffdd8,in_stack_fffffffffffffdd0,
                            in_stack_fffffffffffffdc8,in_stack_fffffffffffffdc4,
                            in_stack_fffffffffffffdc0), bVar1) {
    printPredictions(in_stack_fffffffffffffcf0,(bool)in_stack_fffffffffffffcef,
                     (bool)in_stack_fffffffffffffcee);
  }
  bVar2 = std::ifstream::is_open();
  if ((bVar2 & 1) != 0) {
    std::ifstream::close();
  }
  exit(0);
}

Assistant:

void predict(const std::vector<std::string>& args) {
  if (args.size() < 4 || args.size() > 6) {
    printPredictUsage();
    exit(EXIT_FAILURE);
  }
  int32_t k = 1;
  real threshold = 0.0;
  if (args.size() > 4) {
    k = std::stoi(args[4]);
    if (args.size() == 6) {
      threshold = std::stof(args[5]);
    }
  }

  bool printProb = args[1] == "predict-prob";
  FastText fasttext;
  fasttext.loadModel(std::string(args[2]));

  std::ifstream ifs;
  std::string infile(args[3]);
  bool inputIsStdIn = infile == "-";
  if (!inputIsStdIn) {
    ifs.open(infile);
    if (!inputIsStdIn && !ifs.is_open()) {
      std::cerr << "Input file cannot be opened!" << std::endl;
      exit(EXIT_FAILURE);
    }
  }
  std::istream& in = inputIsStdIn ? std::cin : ifs;
  std::vector<std::pair<real, std::string>> predictions;
  while (fasttext.predictLine(in, predictions, k, threshold)) {
    printPredictions(predictions, printProb, false);
  }
  if (ifs.is_open()) {
    ifs.close();
  }

  exit(0);
}